

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O3

string * __thiscall
anurbs::Entry<anurbs::BrepTrim>::type_name_abi_cxx11_(Entry<anurbs::BrepTrim> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6d69725470657242;
  in_RDI->_M_string_length = 8;
  (in_RDI->field_2)._M_local_buf[8] = '\0';
  return in_RDI;
}

Assistant:

std::string type_name() const override
    {
        return TData::type_name();
    }